

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map_test.cpp
# Opt level: O3

void __thiscall adt_map_test_map_structs_Test::TestBody(adt_map_test_map_structs_Test *this)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  char *pcVar8;
  AssertHelper local_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  internal local_58 [8];
  undefined8 *local_50;
  undefined8 *local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  puVar3 = (undefined8 *)operator_new(0x10);
  *puVar3 = 0;
  puVar3[1] = 0;
  *puVar3 = "random";
  *(undefined4 *)(puVar3 + 1) = 0x7b;
  puVar4 = (undefined8 *)operator_new(0x10);
  *puVar4 = 0;
  puVar4[1] = 0;
  *puVar4 = "random";
  *(undefined4 *)(puVar4 + 1) = 0x141;
  uVar5 = map_create(hash_callback_str,comparable_callback_str);
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_60._M_head_impl._4_4_ << 0x20);
  local_68.data_._0_4_ = map_insert(uVar5,"random",puVar3);
  testing::internal::CmpHelperEQ<int,int>
            (local_58,"(int)0","(int)map_insert(m, (map_key)a->str, a)",(int *)&local_60,
             (int *)&local_68);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50 == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (char *)*local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_map_test/source/adt_map_test.cpp"
               ,0xc2,pcVar8);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  puVar7 = local_50;
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(puVar7);
  }
  local_60._M_head_impl = local_60._M_head_impl & 0xffffffff00000000;
  uVar2 = map_insert(uVar5,*puVar4,puVar4);
  local_68.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_58,"(int)0","(int)map_insert(m, (map_key)b->str, b)",(int *)&local_60,
             (int *)&local_68);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50 == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (char *)*local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_map_test/source/adt_map_test.cpp"
               ,0xc3,pcVar8);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  puVar7 = local_50;
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(puVar7);
  }
  uVar6 = map_get(uVar5,"random");
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)vector_size(uVar6)
  ;
  local_68.data_ = (AssertHelperData *)0x2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_58,"(size_t)vector_size(v)","(size_t)2",(unsigned_long *)&local_60,
             (unsigned_long *)&local_68);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50 == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (char *)*local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_map_test/source/adt_map_test.cpp"
               ,199,pcVar8);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  puVar7 = local_50;
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(puVar7);
  }
  puVar7 = (undefined8 *)vector_at(uVar6,0);
  puVar7 = (undefined8 *)*puVar7;
  local_60._M_head_impl._0_4_ =
       (uint)(*(int *)(puVar7 + 1) == 0x141 || *(int *)(puVar7 + 1) == 0x7b);
  local_68.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            (local_58,"(int)(123 == value0->a || 321 == value0->a)","(int)1",(int *)&local_60,
             (int *)&local_68);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50 == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (char *)*local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_map_test/source/adt_map_test.cpp"
               ,0xcb,pcVar8);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  puVar1 = local_50;
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(puVar1);
  }
  local_48 = (undefined8 *)vector_at(uVar6,1);
  local_48 = (undefined8 *)*local_48;
  local_60._M_head_impl._0_4_ =
       (uint)(*(int *)(local_48 + 1) == 0x141 || *(int *)(local_48 + 1) == 0x7b);
  local_68.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            (local_58,"(int)(123 == value1->a || 321 == value1->a)","(int)1",(int *)&local_60,
             (int *)&local_68);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50 == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (char *)*local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_map_test/source/adt_map_test.cpp"
               ,0xcf,pcVar8);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  puVar1 = local_50;
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(puVar1);
  }
  local_60._M_head_impl._0_4_ = (uint)(puVar3 == local_48 || puVar3 == puVar7);
  local_68.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            (local_58,"(int)(a == value0 || a == value1)","(int)1",(int *)&local_60,(int *)&local_68
            );
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50 == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (char *)*local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_map_test/source/adt_map_test.cpp"
               ,0xd1,pcVar8);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  puVar1 = local_50;
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(puVar1);
  }
  local_60._M_head_impl._0_4_ = (uint)(puVar4 == local_48 || puVar4 == puVar7);
  local_68.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            (local_58,"(int)(b == value0 || b == value1)","(int)1",(int *)&local_60,(int *)&local_68
            );
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50 == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (char *)*local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_map_test/source/adt_map_test.cpp"
               ,0xd2,pcVar8);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  local_40 = uVar6;
  local_38 = uVar5;
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(local_50);
  }
  log_write_impl_va("metacall",0xd4,"TestBody",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_map_test/source/adt_map_test.cpp"
                    ,0,"A-B %p | %p",puVar3,puVar4);
  log_write_impl_va("metacall",0xd5,"TestBody",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_map_test/source/adt_map_test.cpp"
                    ,0,"val %p | %p",puVar7,local_48);
  vector_destroy(local_40);
  map_destroy(local_38);
  operator_delete(puVar3);
  operator_delete(puVar4);
  return;
}

Assistant:

TEST_F(adt_map_test, map_structs)
{
	typedef struct stru_type
	{
		const char *str;
		int a;
	} * stru;

	static const char k[] = "random";

	stru a = new stru_type();
	a->str = k;
	a->a = 123;

	stru b = new stru_type();
	b->str = k;
	b->a = 321;

	map m = map_create(&hash_callback_str, &comparable_callback_str);

	EXPECT_EQ((int)0, (int)map_insert(m, (map_key)a->str, a));
	EXPECT_EQ((int)0, (int)map_insert(m, (map_key)b->str, b));

	vector v = map_get(m, (map_key)k);

	EXPECT_EQ((size_t)vector_size(v), (size_t)2);

	stru value0 = vector_at_type(v, 0, stru);

	EXPECT_EQ((int)(123 == value0->a || 321 == value0->a), (int)1);

	stru value1 = vector_at_type(v, 1, stru);

	EXPECT_EQ((int)(123 == value1->a || 321 == value1->a), (int)1);

	EXPECT_EQ((int)(a == value0 || a == value1), (int)1);
	EXPECT_EQ((int)(b == value0 || b == value1), (int)1);

	log_write("metacall", LOG_LEVEL_DEBUG, "A-B %p | %p", a, b);
	log_write("metacall", LOG_LEVEL_DEBUG, "val %p | %p", value0, value1);

	vector_destroy(v);

	map_destroy(m);

	delete a;
	delete b;
}